

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

uint64_t __thiscall kratos::Context::get_hash(Context *this,Generator *generator)

{
  bool bVar1;
  mapped_type *pmVar2;
  runtime_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view format_str;
  string local_58;
  pointer local_38;
  size_type sStack_30;
  Generator *local_28;
  Generator *generator_local;
  
  local_28 = generator;
  bVar1 = has_hash(this,generator);
  if (bVar1) {
    pmVar2 = std::__detail::
             _Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->generator_hash_,&local_28);
    return *pmVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_38 = (generator->name)._M_dataplus._M_p;
  sStack_30 = (generator->name)._M_string_length;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0}\'s hash has not been computed");
  format_str.data_ = (char *)bVar3.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_38;
  format_str.size_ = 0xd;
  fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)bVar3.data_,format_str,args);
  std::runtime_error::runtime_error(this_00,(string *)&local_58);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t Context::get_hash(const Generator *generator) const {
    if (!has_hash(generator))
        throw ::runtime_error(::format("{0}'s hash has not been computed", generator->name));
    return generator_hash_.at(generator);
}